

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

void writeprocs(void)

{
  int iVar1;
  symboltype sVar2;
  bool bVar3;
  undefined1 local_70 [24];
  int local_58;
  undefined1 local_54 [24];
  int local_3c;
  undefined1 local_38 [8];
  quadtype nextquad;
  char label [10];
  int localvarbytes;
  int i;
  
  label[6] = '\0';
  label[7] = '\0';
  label[8] = '\0';
  label[9] = '\0';
LAB_0010aef6:
  iVar1 = getnumcodes();
  if (iVar1 <= (int)label._6_4_) {
    return;
  }
  getquad((quadtype *)local_54,label._6_4_);
  local_38 = (undefined1  [8])local_54._0_8_;
  nextquad.opcode = local_54._8_4_;
  nextquad.op1.opndtype = local_54._12_4_;
  nextquad.op1.opnd = local_54._16_4_;
  nextquad.op2.opndtype = local_54._20_4_;
  nextquad.op2.opnd = local_3c;
  do {
    if (local_38._0_4_ == oplabel) {
      sVar2 = symclass(nextquad.opcode);
      bVar3 = false;
      if (sVar2 != stprocedure) goto LAB_0010af52;
    }
    else {
LAB_0010af52:
      sVar2 = symclass(nextquad.opcode);
      bVar3 = sVar2 != stprogram;
    }
    if (!bVar3) break;
    label._6_4_ = label._6_4_ + 1;
    getquad((quadtype *)local_70,label._6_4_);
    local_38._0_4_ = local_70._0_4_;
    local_38._4_4_ = local_70._4_4_;
    nextquad.opcode = local_70._8_4_;
    nextquad.op1.opndtype = local_70._12_4_;
    nextquad.op1.opnd = local_70._16_4_;
    nextquad.op2.opndtype = local_70._20_4_;
    nextquad.op2.opnd = local_58;
  } while( true );
  sVar2 = symclass(nextquad.opcode);
  if (sVar2 == stprogram) {
    return;
  }
  iVar1 = labelscope(nextquad.opcode);
  getlabel(nextquad.opcode,(char *)((long)&nextquad.op3.opndtype + 2));
  writeproc(label._6_4_,iVar1);
  label._6_4_ = label._6_4_ + 1;
  goto LAB_0010aef6;
}

Assistant:

void    writeprocs(void)
{
    int    i = 0, localvarbytes;
    char    label[LABELSIZE];
    struct quadtype        nextquad;
    
    for (i = 0; i < getnumcodes(); i++)    {
        nextquad = getquad(i);
        
        while ((nextquad.opcode != oplabel
                || symclass(nextquad.op1.opnd) != stprocedure)
               && symclass(nextquad.op1.opnd) != stprogram)
            nextquad = getquad(++i);
        
        if (symclass(nextquad.op1.opnd) == stprogram)
            break;
        
        localvarbytes = labelscope(nextquad.op1.opnd);
        //  printf("Used %d bytes\n", localvarbytes);
        getlabel(nextquad.op1.opnd, label);
        writeproc(i, localvarbytes);
    }
}